

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationSettings::operator==(CollationSettings *this,CollationSettings *other)

{
  int local_24;
  int32_t i;
  CollationSettings *other_local;
  CollationSettings *this_local;
  
  if (this->options == other->options) {
    if (((this->options & 0xcU) == 0) || (this->variableTop == other->variableTop)) {
      if (this->reorderCodesLength == other->reorderCodesLength) {
        for (local_24 = 0; local_24 < this->reorderCodesLength; local_24 = local_24 + 1) {
          if (this->reorderCodes[local_24] != other->reorderCodes[local_24]) {
            return '\0';
          }
        }
        this_local._7_1_ = '\x01';
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationSettings::operator==(const CollationSettings &other) const {
    if(options != other.options) { return FALSE; }
    if((options & ALTERNATE_MASK) != 0 && variableTop != other.variableTop) { return FALSE; }
    if(reorderCodesLength != other.reorderCodesLength) { return FALSE; }
    for(int32_t i = 0; i < reorderCodesLength; ++i) {
        if(reorderCodes[i] != other.reorderCodes[i]) { return FALSE; }
    }
    return TRUE;
}